

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv4Transmitter::SendRTCPData(RTPUDPv4Transmitter *this,void *data,size_t len)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  int iVar3;
  
  if (this->init == true) {
    if (this->created == true) {
      if (this->maxpacksize < len) {
        iVar3 = -0x5d;
      }
      else {
        pHVar2 = (this->destinations).firsthashelem;
        (this->destinations).curhashelem = pHVar2;
        iVar3 = 0;
        while (pHVar2 != (HashElement *)0x0) {
          sendto(this->rtcpsock,data,len,0,(sockaddr *)&(pHVar2->element).rtcpaddr,0x10);
          pHVar1 = (this->destinations).curhashelem;
          pHVar2 = (HashElement *)0x0;
          if (pHVar1 != (HashElement *)0x0) {
            pHVar2 = pHVar1->listnext;
            (this->destinations).curhashelem = pHVar2;
          }
        }
      }
    }
    else {
      iVar3 = -0x59;
    }
  }
  else {
    iVar3 = -0x5a;
  }
  return iVar3;
}

Assistant:

int RTPUDPv4Transmitter::SendRTCPData(const void *data,size_t len)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	destinations.GotoFirstElement();
	while (destinations.HasCurrentElement())
	{
		sendto(rtcpsock,(const char *)data,len,0,(const struct sockaddr *)destinations.GetCurrentElement().GetRTCPSockAddr(),sizeof(struct sockaddr_in));
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}